

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheMove(PgHdr *p,Pgno newPgno)

{
  uint uVar1;
  
  (*sqlite3Config.pcache2.xRekey)(p->pCache->pCache,p->pPage,p->pgno,newPgno);
  p->pgno = newPgno;
  uVar1._0_2_ = p->flags;
  uVar1._2_2_ = p->nRef;
  if ((~uVar1 & 10) == 0) {
    pcacheManageDirtyList(p,'\x03');
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheMove(PgHdr *p, Pgno newPgno){
  PCache *pCache = p->pCache;
  assert( p->nRef>0 );
  assert( newPgno>0 );
  assert( sqlite3PcachePageSanity(p) );
  pcacheTrace(("%p.MOVE %d -> %d\n",pCache,p->pgno,newPgno));
  sqlite3GlobalConfig.pcache2.xRekey(pCache->pCache, p->pPage, p->pgno,newPgno);
  p->pgno = newPgno;
  if( (p->flags&PGHDR_DIRTY) && (p->flags&PGHDR_NEED_SYNC) ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
  }
}